

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O0

SeatDialogPromptDescriptions * tempseat_prompt_descriptions(Seat *seat)

{
  SeatDialogPromptDescriptions *pSVar1;
  TempSeat *ts;
  Seat *seat_local;
  
  pSVar1 = seat_prompt_descriptions((Seat *)seat[-10].vt);
  return pSVar1;
}

Assistant:

static const SeatDialogPromptDescriptions *tempseat_prompt_descriptions(
    Seat *seat)
{
    /* It might be OK to put this in the 'unreachable' category, but I
     * think it's equally good to put it here, which allows for
     * someone _preparing_ a prompt right now that they intend to
     * present once the TempSeat has given way to the real one. */
    TempSeat *ts = container_of(seat, TempSeat, seat);
    return seat_prompt_descriptions(ts->realseat);
}